

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3SelectPrep(Parse *pParse,Select *p,NameContext *pOuterNC)

{
  Walker local_50;
  
  if ((pParse->db->mallocFailed == '\0') && ((p->selFlags & 0x80) == 0)) {
    local_50.xExprCallback = sqlite3ExprWalkNoop;
    local_50.pParse = pParse;
    if (pParse->hasCompound != '\0') {
      local_50.xSelectCallback = convertCompoundSelectToSubquery;
      local_50.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
      sqlite3WalkSelect(&local_50,p);
    }
    local_50.xSelectCallback = selectExpander;
    local_50.xSelectCallback2 = selectPopWith;
    sqlite3WalkSelect(&local_50,p);
    if ((pParse->nErr == 0) && (pParse->db->mallocFailed == '\0')) {
      sqlite3ResolveSelectNames(pParse,p,pOuterNC);
      if ((pParse->nErr == 0) && (pParse->db->mallocFailed == '\0')) {
        local_50.xSelectCallback = sqlite3SelectWalkNoop;
        local_50.xSelectCallback2 = selectAddSubqueryTypeInfo;
        local_50.xExprCallback = sqlite3ExprWalkNoop;
        local_50.pParse = pParse;
        sqlite3WalkSelect(&local_50,p);
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SelectPrep(
  Parse *pParse,         /* The parser context */
  Select *p,             /* The SELECT statement being coded. */
  NameContext *pOuterNC  /* Name context for container */
){
  assert( p!=0 || pParse->db->mallocFailed );
  if( pParse->db->mallocFailed ) return;
  if( p->selFlags & SF_HasTypeInfo ) return;
  sqlite3SelectExpand(pParse, p);
  if( pParse->nErr || pParse->db->mallocFailed ) return;
  sqlite3ResolveSelectNames(pParse, p, pOuterNC);
  if( pParse->nErr || pParse->db->mallocFailed ) return;
  sqlite3SelectAddTypeInfo(pParse, p);
}